

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_m16sub64_q(DisasContext_conflict14 *ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 arg1_low,
                   TCGv_i32 arg1_high,TCGv_i32 arg2,TCGv_i32 arg3,uint32_t n)

{
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i64 dest;
  TCGv_i64 ret_01;
  TCGv_i64 ret_02;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_2;
  uintptr_t o_3;
  uintptr_t o_4;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  dest = tcg_temp_new_i64(tcg_ctx);
  ret_01 = tcg_temp_new_i64(tcg_ctx);
  ret_02 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_mul_i32(tcg_ctx,ret,arg2,arg3);
  if (n != 0) {
    tcg_gen_shli_i32_tricore(tcg_ctx,ret,ret,1);
    tcg_gen_setcondi_i32_tricore(tcg_ctx,TCG_COND_EQ,ret_00,ret,-0x80000000);
    tcg_gen_sub_i32(tcg_ctx,ret,ret,ret_00);
  }
  tcg_gen_ext_i32_i64_tricore(tcg_ctx,ret_01,ret);
  tcg_gen_shli_i64_tricore(tcg_ctx,ret_01,ret_01,0x10);
  tcg_gen_concat_i32_i64_tricore(tcg_ctx,dest,arg1_low,arg1_high);
  gen_sub64_d(ctx,ret_02,dest,ret_01);
  tcg_gen_extr_i64_i32_tricore(tcg_ctx,rl,rh,ret_02);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(dest + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_02 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void
gen_m16sub64_q(DisasContext *ctx, TCGv rl, TCGv rh, TCGv arg1_low, TCGv arg1_high, TCGv arg2,
               TCGv arg3, uint32_t n)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);
    TCGv temp2 = tcg_temp_new(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

    if (n == 0) {
        tcg_gen_mul_tl(tcg_ctx, temp, arg2, arg3);
    } else { /* n is expected to be 1 */
        tcg_gen_mul_tl(tcg_ctx, temp, arg2, arg3);
        tcg_gen_shli_tl(tcg_ctx, temp, temp, 1);
        /* catch special case r1 = r2 = 0x8000 */
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp2, temp, 0x80000000);
        tcg_gen_sub_tl(tcg_ctx, temp, temp, temp2);
    }
    tcg_gen_ext_i32_i64(tcg_ctx, t2, temp);
    tcg_gen_shli_i64(tcg_ctx, t2, t2, 16);
    tcg_gen_concat_i32_i64(tcg_ctx, t1, arg1_low, arg1_high);
    gen_sub64_d(ctx, t3, t1, t2);
    /* write back result */
    tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t3);

    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
    tcg_temp_free_i64(tcg_ctx, t3);
    tcg_temp_free(tcg_ctx, temp);
    tcg_temp_free(tcg_ctx, temp2);
}